

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O0

RefAST __thiscall ASTFactory::create(ASTFactory *this,RefToken *tok)

{
  AST *this_00;
  undefined8 *in_RSI;
  Ref *in_RDI;
  RefAST *t;
  Ref *this_01;
  RefToken *in_stack_ffffffffffffffc8;
  AST *in_stack_ffffffffffffffd0;
  
  this_01 = in_RDI;
  (**(code **)*in_RSI)();
  this_00 = RefCount<AST>::operator->((RefCount<AST> *)this_01);
  RefCount<Token>::RefCount((RefCount<Token> *)this_00,(RefCount<Token> *)this_01);
  AST::initialize(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  RefCount<Token>::~RefCount((RefCount<Token> *)this_00);
  return (RefAST)in_RDI;
}

Assistant:

RefAST ASTFactory::create(RefToken tok)
{
	RefAST t = create();
	t->initialize(tok);
	return t;
}